

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_sv.c
# Opt level: O1

void dtl_sv_set_type(dtl_sv_t *self,dtl_sv_type_id newType)

{
  adt_str_t *paVar1;
  uint uVar2;
  
  if (self == (dtl_sv_t *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = self->u32Flags >> 4 & 0xf;
  }
  if (uVar2 == 9) {
    if (newType != DTL_SV_STR) {
      adt_str_delete((self->pAny->val).str);
      goto LAB_0013e491;
    }
LAB_0013e49b:
    if (uVar2 == 9) {
      adt_str_clear((self->pAny->val).str);
      goto LAB_0013e4db;
    }
    paVar1 = adt_str_new();
  }
  else {
    if (uVar2 == 0xc) {
      adt_bytes_delete((self->pAny->val).bytes);
LAB_0013e486:
      (self->pAny->val).i64 = 0;
    }
    else if (uVar2 == 0xb) {
      dtl_dv_dec_ref((self->pAny->val).dv);
    }
    else if ((newType != DTL_SV_BYTEARRAY) && (uVar2 == 0xd)) {
      adt_bytearray_delete((self->pAny->val).bytearray);
      goto LAB_0013e486;
    }
LAB_0013e491:
    if (newType != DTL_SV_BYTEARRAY) {
      if (newType != DTL_SV_STR) goto LAB_0013e4db;
      goto LAB_0013e49b;
    }
    if (uVar2 == 0xd) {
      adt_bytearray_clear((self->pAny->val).bytearray);
      goto LAB_0013e4db;
    }
    paVar1 = (adt_str_t *)adt_bytearray_new(0x100);
  }
  (self->pAny->val).str = paVar1;
LAB_0013e4db:
  self->u32Flags = (newType & (DTL_SV_BYTES|DTL_SV_I64)) << 4 | self->u32Flags & 0xffffff0f;
  return;
}

Assistant:

static void dtl_sv_set_type(dtl_sv_t *self, dtl_sv_type_id newType)
{
   dtl_sv_type_id currentType = dtl_sv_type(self);
   if(currentType == DTL_SV_DV)
   {
      dtl_dv_dec_ref(self->pAny->val.dv);
   }
   else if (currentType == DTL_SV_STR)
   {
      if (newType != DTL_SV_STR)
      {
         adt_str_delete(self->pAny->val.str);
      }
   }
   else if (currentType == DTL_SV_BYTES)
   {
      adt_bytes_delete(self->pAny->val.bytes);
      self->pAny->val.bytes = (adt_bytes_t*) 0;
   }
   else if (currentType == DTL_SV_BYTEARRAY)
   {
      if (newType != DTL_SV_BYTEARRAY)
      {
         adt_bytearray_delete(self->pAny->val.bytearray);
         self->pAny->val.bytearray = (adt_bytearray_t*) 0;
      }
   }
   else
   {

   }

   if (newType == DTL_SV_STR)
   {
      if (currentType != DTL_SV_STR)
      {
         self->pAny->val.str = adt_str_new();
      }
      else
      {
         adt_str_clear(self->pAny->val.str);
      }
   }
   else if(newType == DTL_SV_BYTEARRAY)
   {
      if (currentType != DTL_SV_BYTEARRAY)
      {
         self->pAny->val.bytearray = adt_bytearray_new(BYTEARRAY_DEFAULT_GROWSIZE);
      }
      else
      {
         adt_bytearray_clear(self->pAny->val.bytearray);
      }
   }

   self->u32Flags &= ~((uint32_t)DTL_SV_TYPE_MASK);
   self->u32Flags |= (((uint32_t)newType)<<DTL_SV_TYPE_SHIFT) & DTL_SV_TYPE_MASK;
}